

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void ReadConfigROM(BasePort *port,uint boardNum)

{
  byte bVar1;
  _Setfill<char> _Var2;
  uint16_t uVar3;
  uint uVar4;
  __uint32_t _Var5;
  __uint32_t _Var6;
  _Setw _Var7;
  ostream *poVar8;
  void *pvVar9;
  ulong local_b8;
  size_t i_1;
  uint root_dir_crc;
  uint root_len;
  uint16_t crc16;
  uint bus_info_crc;
  uint bus_info_len;
  ulong local_90;
  size_t i;
  quadlet_t block_data [24];
  quadlet_t read_data;
  nodeaddr_t addr;
  uint boardNum_local;
  BasePort *port_local;
  
  bVar1 = (byte)boardNum;
  uVar4 = (*port->_vptr_BasePort[0x23])(port,(ulong)bVar1,0xfffff0000400,block_data + 0x17);
  if ((uVar4 & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Configuration ROM: ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,std::hex);
    pvVar9 = (void *)std::ostream::operator<<(pvVar9,block_data[0x17]);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "Testing with block read (first entry should be ROM, followed by bus info):"
                          );
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  uVar4 = (*port->_vptr_BasePort[0x26])(port,(ulong)bVar1,0xfffff0000400,&i,0x60);
  if ((uVar4 & 1) != 0) {
    for (local_90 = 0; local_90 < 0x18; local_90 = local_90 + 1) {
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
      _Var7 = std::setw(8);
      poVar8 = std::operator<<(poVar8,_Var7);
      _Var2 = std::setfill<char>('0');
      poVar8 = std::operator<<(poVar8,_Var2._M_c);
      _Var5 = __bswap_32(block_data[local_90 - 2]);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,_Var5);
      std::operator<<(poVar8,"  ");
      if ((local_90 & 3) == 3) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  _Var5 = __bswap_32((__uint32_t)i);
  uVar4 = _Var5 >> 0x18;
  poVar8 = std::operator<<((ostream *)&std::cout,"Bus_Info length = ");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar4);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  if (1 < uVar4) {
    _Var5 = __bswap_32((__uint32_t)i);
    uVar3 = ComputeCRC16((uchar *)((long)&i + 4),(ulong)uVar4 << 2);
    poVar8 = std::operator<<((ostream *)&std::cout,"Bus_Info CRC: ROM = ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,std::hex);
    poVar8 = (ostream *)std::ostream::operator<<(pvVar9,_Var5 & 0xffff);
    poVar8 = std::operator<<(poVar8,", Computed = ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar3);
    pvVar9 = (void *)std::ostream::operator<<(pvVar9,std::dec);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    _Var5 = __bswap_32(block_data[(ulong)(uVar4 + 1) - 2]);
    _Var6 = __bswap_32(block_data[(ulong)(uVar4 + 1) - 2]);
    poVar8 = std::operator<<((ostream *)&std::cout,"Root_Directory length = ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,_Var5 >> 0x10);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar3 = ComputeCRC16((uchar *)(block_data + ((ulong)(uVar4 + 2) - 2)),
                         (ulong)(_Var5 >> 0x10) << 2);
    poVar8 = std::operator<<((ostream *)&std::cout,"Root_Dir CRC: ROM = ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,std::hex);
    poVar8 = (ostream *)std::ostream::operator<<(pvVar9,_Var6 & 0xffff);
    poVar8 = std::operator<<(poVar8,", Computed = ");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,uVar3);
    pvVar9 = (void *)std::ostream::operator<<(pvVar9,std::dec);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "Testing again with block read (8th entry should be ROM, followed by bus info):"
                          );
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  uVar4 = (*port->_vptr_BasePort[0x26])(port,(ulong)bVar1,0xfffff00003e4,&i,0x60);
  if ((uVar4 & 1) != 0) {
    for (local_b8 = 0; local_b8 < 0x18; local_b8 = local_b8 + 1) {
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::hex);
      _Var7 = std::setw(8);
      poVar8 = std::operator<<(poVar8,_Var7);
      _Var2 = std::setfill<char>('0');
      poVar8 = std::operator<<(poVar8,_Var2._M_c);
      _Var5 = __bswap_32(block_data[local_b8 - 2]);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,_Var5);
      std::operator<<(poVar8,"  ");
      if ((local_b8 & 3) == 3) {
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void ReadConfigROM(BasePort *port, unsigned int boardNum)
{
    nodeaddr_t addr;
    quadlet_t read_data;
    quadlet_t block_data[24];
    addr = 0xfffff0000400;  // Configuration ROM address
    if (port->ReadQuadlet(boardNum, addr, read_data))
        std::cout << "Configuration ROM: " << std::hex << read_data << std::endl;
    std::cout << "Testing with block read (first entry should be ROM, followed by bus info):" << std::endl;
    if (port->ReadBlock(boardNum, addr, block_data, sizeof(block_data))) {
        for (size_t i = 0; i < sizeof(block_data)/sizeof(quadlet_t); i++) {
            std::cout << std::hex << std::setw(8) << std::setfill('0') << bswap_32(block_data[i]) << "  ";
            if (i%4 == 3) std::cout << std::endl;
        }
    }
    unsigned int bus_info_len = (bswap_32(block_data[0])&0xff000000) >> 24;
    std::cout << "Bus_Info length = " << bus_info_len << std::endl;
    if (bus_info_len > 1) {
        unsigned int bus_info_crc = bswap_32(block_data[0])&0x0000ffff;
        uint16_t crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(&block_data[1]), bus_info_len*sizeof(quadlet_t));
        std::cout << "Bus_Info CRC: ROM = " << std::hex << bus_info_crc << ", Computed = " << crc16 << std::dec << std::endl;
        unsigned int root_len = (bswap_32(block_data[bus_info_len+1])&0xffff0000) >> 16;
        unsigned int root_dir_crc = bswap_32(block_data[bus_info_len+1])&0x0000ffff;
        std::cout << "Root_Directory length = " << root_len << std::endl;
        crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(&block_data[bus_info_len+2]), root_len*sizeof(quadlet_t));
        std::cout << "Root_Dir CRC: ROM = " << std::hex << root_dir_crc << ", Computed = " << crc16 << std::dec << std::endl;
    }
    std::cout << std::endl;
    std::cout << "Testing again with block read (8th entry should be ROM, followed by bus info):" << std::endl;
    if (port->ReadBlock(boardNum, addr-7*sizeof(quadlet_t), block_data, sizeof(block_data))) {
        for (size_t i = 0; i < sizeof(block_data)/sizeof(quadlet_t); i++) {
            std::cout << std::hex << std::setw(8) << std::setfill('0') << bswap_32(block_data[i]) << "  ";
            if (i%4 == 3) std::cout << std::endl;
        }
    }
}